

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack20(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0xc;
    out_local[1] = (*in_local & 0xfff) << 8;
    out_local[1] = in_local[1] >> 0x18 | out_local[1];
    out_local[2] = in_local[1] >> 4 & 0xfffff;
    out_local[3] = (in_local[1] & 0xf) << 0x10;
    out_local[3] = in_local[2] >> 0x10 | out_local[3];
    out_local[4] = (in_local[2] & 0xffff) << 4;
    out_local[4] = in_local[3] >> 0x1c | out_local[4];
    out_local[5] = in_local[3] >> 8 & 0xfffff;
    out_local[6] = (in_local[3] & 0xff) << 0xc;
    out_local[6] = in_local[4] >> 0x14 | out_local[6];
    out_local[7] = in_local[4] & 0xfffff;
    out_local[8] = in_local[5] >> 0xc;
    out_local[9] = (in_local[5] & 0xfff) << 8;
    out_local[9] = in_local[6] >> 0x18 | out_local[9];
    out_local[10] = in_local[6] >> 4 & 0xfffff;
    out_local[0xb] = (in_local[6] & 0xf) << 0x10;
    out_local[0xb] = in_local[7] >> 0x10 | out_local[0xb];
    out_local[0xc] = (in_local[7] & 0xffff) << 4;
    out_local[0xc] = in_local[8] >> 0x1c | out_local[0xc];
    out_local[0xd] = in_local[8] >> 8 & 0xfffff;
    out_local[0xe] = (in_local[8] & 0xff) << 0xc;
    out_local[0xe] = in_local[9] >> 0x14 | out_local[0xe];
    out_local[0xf] = in_local[9] & 0xfffff;
    out_local[0x10] = in_local[10] >> 0xc;
    out_local[0x11] = (in_local[10] & 0xfff) << 8;
    out_local[0x11] = in_local[0xb] >> 0x18 | out_local[0x11];
    out_local[0x12] = in_local[0xb] >> 4 & 0xfffff;
    out_local[0x13] = (in_local[0xb] & 0xf) << 0x10;
    out_local[0x13] = in_local[0xc] >> 0x10 | out_local[0x13];
    out_local[0x14] = (in_local[0xc] & 0xffff) << 4;
    out_local[0x14] = in_local[0xd] >> 0x1c | out_local[0x14];
    out_local[0x15] = in_local[0xd] >> 8 & 0xfffff;
    out_local[0x16] = (in_local[0xd] & 0xff) << 0xc;
    out_local[0x16] = in_local[0xe] >> 0x14 | out_local[0x16];
    out_local[0x17] = in_local[0xe] & 0xfffff;
    out_local[0x18] = in_local[0xf] >> 0xc;
    out_local[0x19] = (in_local[0xf] & 0xfff) << 8;
    out_local[0x19] = in_local[0x10] >> 0x18 | out_local[0x19];
    out_local[0x1a] = in_local[0x10] >> 4 & 0xfffff;
    out_local[0x1b] = (in_local[0x10] & 0xf) << 0x10;
    out_local[0x1b] = in_local[0x11] >> 0x10 | out_local[0x1b];
    out_local[0x1c] = (in_local[0x11] & 0xffff) << 4;
    out_local[0x1c] = in_local[0x12] >> 0x1c | out_local[0x1c];
    out_local[0x1d] = in_local[0x12] >> 8 & 0xfffff;
    out_local[0x1e] = (in_local[0x12] & 0xff) << 0xc;
    out_local[0x1e] = in_local[0x13] >> 0x14 | out_local[0x1e];
    out_local[0x1f] = in_local[0x13] & 0xfffff;
    out_local = out_local + 0x20;
    in_local = in_local + 0x14;
  }
  return;
}

Assistant:

void __vseblocks_unpack20(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 20, --bs) {
    out[0] = in[0] >> 12;
    out[1] = (in[0] << 8) & 0x0fffff;
    out[1] |= in[1] >> 24;
    out[2] = (in[1] >> 4) & 0x0fffff;
    out[3] = (in[1] << 16) & 0x0fffff;
    out[3] |= in[2] >> 16;
    out[4] = (in[2] << 4) & 0x0fffff;
    out[4] |= in[3] >> 28;
    out[5] = (in[3] >> 8) & 0x0fffff;
    out[6] = (in[3] << 12) & 0x0fffff;
    out[6] |= in[4] >> 20;
    out[7] = in[4] & 0x0fffff;
    out[8] = in[5] >> 12;
    out[9] = (in[5] << 8) & 0x0fffff;
    out[9] |= in[6] >> 24;
    out[10] = (in[6] >> 4) & 0x0fffff;
    out[11] = (in[6] << 16) & 0x0fffff;
    out[11] |= in[7] >> 16;
    out[12] = (in[7] << 4) & 0x0fffff;
    out[12] |= in[8] >> 28;
    out[13] = (in[8] >> 8) & 0x0fffff;
    out[14] = (in[8] << 12) & 0x0fffff;
    out[14] |= in[9] >> 20;
    out[15] = in[9] & 0x0fffff;
    out[16] = in[10] >> 12;
    out[17] = (in[10] << 8) & 0x0fffff;
    out[17] |= in[11] >> 24;
    out[18] = (in[11] >> 4) & 0x0fffff;
    out[19] = (in[11] << 16) & 0x0fffff;
    out[19] |= in[12] >> 16;
    out[20] = (in[12] << 4) & 0x0fffff;
    out[20] |= in[13] >> 28;
    out[21] = (in[13] >> 8) & 0x0fffff;
    out[22] = (in[13] << 12) & 0x0fffff;
    out[22] |= in[14] >> 20;
    out[23] = in[14] & 0x0fffff;
    out[24] = in[15] >> 12;
    out[25] = (in[15] << 8) & 0x0fffff;
    out[25] |= in[16] >> 24;
    out[26] = (in[16] >> 4) & 0x0fffff;
    out[27] = (in[16] << 16) & 0x0fffff;
    out[27] |= in[17] >> 16;
    out[28] = (in[17] << 4) & 0x0fffff;
    out[28] |= in[18] >> 28;
    out[29] = (in[18] >> 8) & 0x0fffff;
    out[30] = (in[18] << 12) & 0x0fffff;
    out[30] |= in[19] >> 20;
    out[31] = in[19] & 0x0fffff;
  }
}